

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

upb_EncodeStatus
upb_EncodeLengthPrefixed
          (upb_Message *msg,upb_MiniTable *l,int options,upb_Arena *arena,char **buf,size_t *size)

{
  upb_EncodeStatus uVar1;
  size_t *size_local;
  char **buf_local;
  upb_Arena *arena_local;
  int options_local;
  upb_MiniTable *l_local;
  upb_Message *msg_local;
  
  uVar1 = _upb_Encode(msg,l,options,arena,buf,size,true);
  return uVar1;
}

Assistant:

upb_EncodeStatus upb_EncodeLengthPrefixed(const upb_Message* msg,
                                          const upb_MiniTable* l, int options,
                                          upb_Arena* arena, char** buf,
                                          size_t* size) {
  return _upb_Encode(msg, l, options, arena, buf, size, true);
}